

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O1

void helper_crypto_sha512su0_aarch64(void *vd,void *vn)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t *rn;
  
  uVar1 = *(ulong *)((long)vd + 8);
  uVar2 = *vn;
  *(ulong *)vd = *vd + (uVar1 >> 7 ^
                       (uVar1 << 0x38 | uVar1 >> 8) ^
                       (uVar1 >> 1 | (ulong)((uVar1 & 1) != 0) << 0x3f));
  *(ulong *)((long)vd + 8) =
       (uVar2 >> 7 ^ (uVar2 << 0x38 | uVar2 >> 8) ^ (uVar2 >> 1 | (ulong)((uVar2 & 1) != 0) << 0x3f)
       ) + uVar1;
  return;
}

Assistant:

void HELPER(crypto_sha512su0)(void *vd, void *vn)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t d0 = rd[0];
    uint64_t d1 = rd[1];

    d0 += s0_512(rd[1]);
    d1 += s0_512(rn[0]);

    rd[0] = d0;
    rd[1] = d1;
}